

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O0

int __thiscall YAML::RegEx::Match<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  bool bVar1;
  RegEx *in_RDI;
  StreamCharSource *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  bVar1 = IsValidSource<YAML::StreamCharSource>
                    ((RegEx *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  if (bVar1) {
    iVar2 = MatchUnchecked<YAML::StreamCharSource>
                      (in_RDI,(StreamCharSource *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

inline int RegEx::Match(const Source& source) const {
  return IsValidSource(source) ? MatchUnchecked(source) : -1;
}